

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (UnicodeString *__return_storage_ptr__,PluralFormat *this,double number,UErrorCode *status
          )

{
  UnicodeString *that;
  FieldPosition fpos;
  UnicodeString result;
  FieldPosition local_e0;
  UnicodeString local_c8;
  Formattable local_88;
  
  local_e0.super_UObject._vptr_UObject = (_func_int **)&PTR__FieldPosition_003a3e18;
  local_e0.fField = -1;
  local_e0.fBeginIndex = 0;
  local_e0.fEndIndex = 0;
  local_c8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
  local_c8.fUnion.fStackFields.fLengthAndFlags = 2;
  Formattable::Formattable(&local_88,number);
  that = format(this,&local_88,number,&local_c8,&local_e0,status);
  UnicodeString::UnicodeString(__return_storage_ptr__,that);
  Formattable::~Formattable(&local_88);
  UnicodeString::~UnicodeString(&local_c8);
  FieldPosition::~FieldPosition(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralFormat::format(double number, UErrorCode& status) const {
    FieldPosition fpos(FieldPosition::DONT_CARE);
    UnicodeString result;
    return format(Formattable(number), number, result, fpos, status);
}